

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_ldpc_file_formats.hpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> *
LDPC4QKD::read_rate_adaption_from_csv<unsigned_int>
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          string *file_path)

{
  byte bVar1;
  bool bVar2;
  runtime_error *this;
  istream *piVar3;
  const_reference pvVar4;
  stringstream s_1;
  exception *e;
  stringstream s;
  undefined1 local_270 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> vec_of_two;
  undefined1 local_250 [8];
  string current_line;
  long local_220;
  ifstream fs;
  string *file_path_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *rows_to_combine;
  
  std::ifstream::ifstream(&local_220,file_path,8);
  bVar1 = std::ios::operator!((ios *)((long)&local_220 + *(long *)(local_220 + -0x18)));
  if ((bVar1 & 1) != 0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Stream object invalid.");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)local_250);
  vec_of_two.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  memset(__return_storage_ptr__,0,0x18);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(__return_storage_ptr__);
  while( true ) {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&local_220,(string *)local_250);
    bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    if (!bVar2) break;
    HelpersReadFilesLDPC::helper_parse_sep_ints<unsigned_int>
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_270,(string *)local_250,
               ',');
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_270,0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (__return_storage_ptr__,pvVar4);
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_270,1);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (__return_storage_ptr__,pvVar4);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_270);
  }
  vec_of_two.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  std::__cxx11::string::~string((string *)local_250);
  std::ifstream::~ifstream(&local_220);
  return __return_storage_ptr__;
}

Assistant:

std::vector<rowidx> read_rate_adaption_from_csv(const std::string &file_path) {
        try {
            std::ifstream fs(file_path);
            if (!fs) {
                throw std::runtime_error("Stream object invalid.");
            }

            std::string current_line;

            std::vector<rowidx> rows_to_combine{};

            while(getline(fs, current_line)) {
                const auto vec_of_two = HelpersReadFilesLDPC::helper_parse_sep_ints<rowidx>(current_line, ',');
                rows_to_combine.push_back(vec_of_two.at(0));
                rows_to_combine.push_back(vec_of_two.at(1));
            }

            return rows_to_combine;
        }
        catch (const std::exception &e) {
            std::stringstream s;
            s << "Failed to read rate adaption from file '" << file_path << "'. Reason:\n" << e.what() << "\n";
            throw std::runtime_error(s.str());
        }
        catch (...) {
            std::stringstream s;
            s << "Failed to read read rate adaption from file '" << file_path << "' due to unknown error.";
            throw std::runtime_error(s.str());
        }
    }